

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O2

EVsource old_EVcreate_submit_handle(CManager cm,EVstone stone,CMFormatList format_list)

{
  undefined8 *puVar1;
  FMFieldList list;
  int iVar2;
  CMFormatList pCVar3;
  FMStructDescList data_format;
  EVsource p_Var4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar7 = (ulong)(uint)stone;
  uVar8 = 0x20;
  lVar6 = 0;
  for (pCVar3 = format_list;
      (format_list != (CMFormatList)0x0 && (pCVar3->format_name != (char *)0x0));
      pCVar3 = pCVar3 + 1) {
    lVar6 = lVar6 + 1;
    uVar8 = uVar8 + 0x20;
  }
  data_format = (FMStructDescList)INT_CMmalloc(uVar8 & 0x1fffffffe0);
  lVar5 = 8;
  while (bVar9 = lVar6 != 0, lVar6 = lVar6 + -1, bVar9) {
    *(undefined8 *)((long)data_format + lVar5 * 2 + -0x10) =
         *(undefined8 *)((long)format_list + lVar5 + -8);
    list = *(FMFieldList *)((long)&format_list->format_name + lVar5);
    *(FMFieldList *)((long)data_format + lVar5 * 2 + -8) = list;
    iVar2 = struct_size_field_list(list,(int)uVar7);
    *(int *)((long)&data_format->format_name + lVar5 * 2) = iVar2;
    *(undefined8 *)((long)&data_format->field_list + lVar5 * 2) = 0;
    lVar5 = lVar5 + 0x10;
  }
  puVar1 = (undefined8 *)((long)&data_format[-1].format_name + uVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  p_Var4 = EVcreate_submit_handle(cm,stone,data_format);
  return p_Var4;
}

Assistant:

extern EVsource
old_EVcreate_submit_handle(CManager cm, EVstone stone, CMFormatList format_list)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVcreate_submit_handle(cm, stone, structs);
}